

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdAlias.c
# Opt level: O0

void CmdCommandAliasAdd(Abc_Frame_t *pAbc,char *sName,int argc,char **argv)

{
  int iVar1;
  char *value;
  char *pcVar2;
  void *pvVar3;
  int local_38;
  int i;
  int fStatus;
  Abc_Alias *pAlias;
  char **argv_local;
  int argc_local;
  char *sName_local;
  Abc_Frame_t *pAbc_local;
  
  value = (char *)malloc(0x18);
  pcVar2 = Extra_UtilStrsav(sName);
  *(char **)value = pcVar2;
  *(int *)(value + 8) = argc;
  pvVar3 = malloc((long)*(int *)(value + 8) << 3);
  *(void **)(value + 0x10) = pvVar3;
  for (local_38 = 0; local_38 < argc; local_38 = local_38 + 1) {
    pcVar2 = Extra_UtilStrsav(argv[local_38]);
    *(char **)(*(long *)(value + 0x10) + (long)local_38 * 8) = pcVar2;
  }
  iVar1 = st__insert(pAbc->tAliases,*(char **)value,value);
  if (iVar1 == 0) {
    return;
  }
  __assert_fail("!fStatus",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/cmd/cmdAlias.c"
                ,0x3a,"void CmdCommandAliasAdd(Abc_Frame_t *, char *, int, char **)");
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    []

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
void CmdCommandAliasAdd( Abc_Frame_t * pAbc, char * sName, int argc, char ** argv )
{
    Abc_Alias * pAlias;
    int fStatus, i;

    pAlias = ABC_ALLOC(Abc_Alias, 1);
    pAlias->sName = Extra_UtilStrsav(sName);
    pAlias->argc = argc;
    pAlias->argv = ABC_ALLOC(char *, pAlias->argc);
    for(i = 0; i < argc; i++) 
        pAlias->argv[i] = Extra_UtilStrsav(argv[i]);
    fStatus = st__insert( pAbc->tAliases, pAlias->sName, (char *) pAlias );
    assert(!fStatus);  
}